

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O3

RationalNum operator/(RationalNum *left,RationalNum *right)

{
  RationalNum RVar1;
  RationalNum temp_2;
  RationalNum temp_1;
  RationalNum local_30;
  RationalNum local_20;
  
  local_20.numerator = (longlong)(int)left->numerator;
  RationalNum::setDenominator(&local_20,(long)(int)left->denominator);
  RationalNum::simplify(&local_20);
  local_30.numerator = (longlong)(int)right->denominator;
  RationalNum::setDenominator(&local_30,(long)(int)right->numerator);
  RationalNum::simplify(&local_30);
  RVar1 = operator*(&local_20,&local_30);
  return RVar1;
}

Assistant:

RationalNum operator/(const RationalNum &left, const RationalNum &right) {
    RationalNum temp_1(left.getNumerator(), left.getDenominator());
    RationalNum temp_2(right.getDenominator(), right.getNumerator());
    return temp_1 * temp_2;
}